

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall
QO_Manager::ConvertBitmapToVec
          (QO_Manager *this,int bitmap,vector<int,_std::allocator<int>_> *relsInJoin)

{
  uint local_1c;
  
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    if (((uint)bitmap >> (local_1c & 0x1f) & 1) != 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                (relsInJoin,(value_type_conflict1 *)&local_1c);
    }
  }
  return 0;
}

Assistant:

RC QO_Manager::ConvertBitmapToVec(int bitmap, vector<int> &relsInJoin){
  for(int i = 0; i < 8*sizeof(int); i++){
    if((bitmap &(1 << i)))
      relsInJoin.push_back(i);
  }
  return (0);
}